

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O0

void soplex::MPSwriteRecord
               (ostream *os,char *indicator,char *name,SPxOut *spxout,char *name1,Rational *value1,
               char *name2,Rational *value2)

{
  Verbosity VVar1;
  streamoff sVar2;
  SPxOut *in_RCX;
  char *in_RDX;
  SPxOut *in_RSI;
  ostream *in_RDI;
  long in_R8;
  long in_stack_00000008;
  Verbosity old_verbosity;
  longlong pos;
  char buf [81];
  SPxOut *local_d8;
  undefined4 local_b8;
  Verbosity local_b4;
  fpos local_b0 [16];
  fpos local_a0 [16];
  streamoff local_90;
  char local_88 [48];
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  
  local_a0 = (fpos  [16])std::ostream::tellp();
  local_d8 = in_RSI;
  local_90 = std::fpos::operator_cast_to_long(local_a0);
  if (local_d8 == (SPxOut *)0x0) {
    local_d8 = (SPxOut *)0x7e8123;
  }
  if (in_RDX == (char *)0x0) {
    in_RDX = "";
  }
  spxSnprintf(local_88,0x51," %-2.2s %-8.8s",local_d8,in_RDX);
  std::operator<<(in_RDI,local_88);
  if (in_R8 != 0) {
    spxSnprintf(local_88,0x51," %-8.8s ",in_R8);
    std::operator<<(in_RDI,local_88);
    boost::multiprecision::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (in_stack_00000008 != 0) {
      spxSnprintf(local_88,0x51," %-8.8s ",in_stack_00000008);
      std::operator<<(in_RDI,local_88);
      boost::multiprecision::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  local_b0 = (fpos  [16])std::ostream::tellp();
  sVar2 = std::fpos::operator_cast_to_long(local_b0);
  if ((0x10000 < sVar2 - local_90) && (in_RCX != (SPxOut *)0x0)) {
    VVar1 = SPxOut::getVerbosity(in_RCX);
    if (0 < (int)VVar1) {
      local_b4 = SPxOut::getVerbosity(in_RCX);
      local_b8 = 1;
      (*in_RCX->_vptr_SPxOut[2])(in_RCX,&local_b8);
      operator<<(local_d8,in_RDX);
      (*in_RCX->_vptr_SPxOut[2])(in_RCX,&local_b4);
    }
  }
  return;
}

Assistant:

static void MPSwriteRecord(
   std::ostream&  os,
   const char*    indicator,
   const char*    name,
   SPxOut* spxout,
   const char*    name1  = nullptr,
   const Rational value1 = 0,
   const char*    name2  = nullptr,
   const Rational value2 = 0
)
{
   char buf[81];
   long long pos;
   pos = os.tellp();

   spxSnprintf(buf, sizeof(buf), " %-2.2s %-8.8s", (indicator == nullptr) ? "" : indicator,
               (name == nullptr)      ? "" : name);
   os << buf;

   if(name1 != nullptr)
   {
      spxSnprintf(buf, sizeof(buf), " %-8.8s ", name1);
      os << buf << value1;

      if(name2 != nullptr)
      {
         spxSnprintf(buf, sizeof(buf), " %-8.8s ", name2);
         os << buf << value2;
      }
   }

   os << std::endl;

   // Warning if line is too long
   if((long long)(os.tellp()) - pos > SOPLEX_MAX_LINE_WRITE_LEN)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR04 Warning: SOPLEX_MAX_LINE_WRITE_LEN exceeded when writing MPS file\n");
   }
}